

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-ping-udp.c
# Opt level: O3

void ping_udp_cold_3(void)

{
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-ping-udp.c"
          ,0x82,"uv_udp_read_start failed");
  fflush(_stderr);
  abort();
}

Assistant:

static void udp_pinger_new(void) {
  pinger_t* pinger = malloc(sizeof(*pinger));
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &pinger->server_addr));
  pinger->state = 0;
  pinger->pongs = 0;

  /* Try to do NUM_PINGS ping-pongs (connection-less). */
  r = uv_udp_init(loop, &pinger->udp);
  ASSERT(r == 0);

  pinger->udp.data = pinger;

  /* Start pinging */
  if (0 != uv_udp_recv_start(&pinger->udp, buf_alloc, pinger_read_cb)) {
    FATAL("uv_udp_read_start failed");
  }
  pinger_write_ping(pinger);
}